

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O2

void __thiscall
ylt::metric::basic_static_counter<double>::serialize_default_label
          (basic_static_counter<double> *this,string *str,double value)

{
  char *__s;
  string local_38;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (str,&(this->super_static_metric).super_metric_t.name_);
  if ((this->super_static_metric).super_metric_t.labels_name_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->super_static_metric).super_metric_t.labels_name_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __s = " ";
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(str,"{")
    ;
    build_string(this,str,&(this->super_static_metric).super_metric_t.labels_name_,
                 &(this->super_static_metric).super_metric_t.labels_value_);
    __s = "} ";
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(str,__s);
  std::__cxx11::to_string(&local_38,value);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (str,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(str,"\n");
  return;
}

Assistant:

void serialize_default_label(std::string &str, value_type value) {
    str.append(name_);
    if (labels_name_.empty()) {
      str.append(" ");
    }
    else {
      str.append("{");
      build_string(str, labels_name_, labels_value_);
      str.append("} ");
    }

    str.append(std::to_string(value));

    str.append("\n");
  }